

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O1

void pnga_lu_solve(char *tran,Integer g_a,Integer g_b)

{
  Integer dimsB [2];
  Integer ndim;
  Integer typeB;
  Integer typeA;
  Integer dimsA [2];
  long local_68;
  long local_60;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  long local_38;
  long local_30;
  
  pnga_check_handle(g_a,"ga_lu_solve: a");
  pnga_check_handle(g_b,"ga_lu_solve: b");
  pnga_inquire(g_a,&local_40,&local_50,&local_38);
  pnga_inquire(g_b,&local_48,&local_50,&local_68);
  if ((10000 < local_30 * local_38) || (10000 < local_68 * local_60)) {
    pnga_error("ga_lu_solve:Array size too large. Use scalapack for optimum performance. configure --with-scalapack or --with-scalapack-i8 for ga_lu_solve to use Scalapack interface"
               ,0);
  }
  pnga_lu_solve_seq(tran,g_a,g_b);
  return;
}

Assistant:

void pnga_lu_solve(char *tran, Integer g_a, Integer g_b) {

  Integer dimA1, dimA2, typeA;
  Integer dimB1, dimB2, typeB;
  Integer dimsA[2], dimsB[2], ndim;

  /** check GA info for input arrays */
  pnga_check_handle(g_a, "ga_lu_solve: a");
  pnga_check_handle(g_b, "ga_lu_solve: b");
  pnga_inquire (g_a, &typeA, &ndim, dimsA);
  pnga_inquire (g_b, &typeB, &ndim, dimsB);
  dimA1 = dimsA[0];
  dimA2 = dimsA[1];
  dimB1 = dimsB[0];
  dimB2 = dimsB[1];
  
  if( (dimA1*dimA2 > _MAX_PROB_SIZE_) || (dimB1*dimB2 > _MAX_PROB_SIZE_) )
    pnga_error("ga_lu_solve:Array size too large. Use scalapack for optimum performance. configure --with-scalapack or --with-scalapack-i8 for ga_lu_solve to use Scalapack interface",0L);

  pnga_lu_solve_seq(tran, g_a, g_b);
}